

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::SoPlexBase<double>::getDualReal(SoPlexBase<double> *this,double *p_vector,int dim)

{
  pointer __src;
  size_t __n;
  bool bVar1;
  
  if (((this->_hasSolReal == false) && ((this->_hasSolRational & 1U) == 0)) ||
     (dim < (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum)) {
    bVar1 = false;
  }
  else {
    _syncRealSolution(this);
    __src = (this->_solReal)._dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    bVar1 = true;
    __n = (long)(this->_solReal)._dual.val.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(p_vector,__src,__n);
    }
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getDualReal(R* p_vector, int dim) // For SCIP
{
   if(hasSol() && dim >= numRows())
   {
      _syncRealSolution();
      auto& dual = _solReal._dual;
      std::copy(dual.begin(), dual.end(), p_vector);

      return true;
   }
   else
      return false;

}